

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basics_gen.c
# Opt level: O0

void greetable_proxy_g_signal
               (GDBusProxy *proxy,gchar *sender_name,gchar *signal_name,GVariant *parameters)

{
  undefined8 uVar1;
  undefined4 uVar2;
  long lVar3;
  long lVar4;
  GType GVar5;
  long lVar6;
  _ExtendedGDBusArgInfo *arg_info;
  ulong uStack_d0;
  guint signal_id;
  gsize n;
  gsize num_params;
  GValue *paramv;
  GVariant *child;
  GVariantIter iter;
  _ExtendedGDBusSignalInfo *info;
  GVariant *parameters_local;
  gchar *signal_name_local;
  gchar *sender_name_local;
  GDBusProxy *proxy_local;
  
  iter.x[0xf] = g_dbus_interface_info_lookup_signal(&_greetable_interface_info,signal_name);
  if (iter.x[0xf] != 0) {
    lVar3 = g_variant_n_children(parameters);
    lVar4 = g_malloc0_n(lVar3 + 1,0x18);
    GVar5 = greetable_get_type();
    g_value_init(lVar4,GVar5);
    g_value_set_object(lVar4,proxy);
    g_variant_iter_init(&child,parameters);
    uStack_d0 = 1;
    while (lVar6 = g_variant_iter_next_value(&child), lVar6 != 0) {
      if (*(int *)(*(long *)(*(long *)(iter.x[0xf] + 0x10) + (uStack_d0 + -1) * 8) + 0x20) == 0) {
        g_dbus_gvariant_to_gvalue(lVar6,lVar4 + uStack_d0 * 0x18);
      }
      else {
        g_value_init(lVar4 + uStack_d0 * 0x18,0x54);
        g_value_set_variant(lVar4 + uStack_d0 * 0x18,lVar6);
      }
      uStack_d0 = uStack_d0 + 1;
      g_variant_unref(lVar6);
    }
    uVar1 = *(undefined8 *)(iter.x[0xf] + 0x20);
    GVar5 = greetable_get_type();
    uVar2 = g_signal_lookup(uVar1,GVar5);
    g_signal_emitv(lVar4,uVar2,0,0);
    for (uStack_d0 = 0; uStack_d0 < lVar3 + 1U; uStack_d0 = uStack_d0 + 1) {
      g_value_unset(lVar4 + uStack_d0 * 0x18);
    }
    g_free(lVar4);
  }
  return;
}

Assistant:

static void
greetable_proxy_g_signal (GDBusProxy *proxy,
  const gchar *sender_name G_GNUC_UNUSED,
  const gchar *signal_name,
  GVariant *parameters)
{
  _ExtendedGDBusSignalInfo *info;
  GVariantIter iter;
  GVariant *child;
  GValue *paramv;
  gsize num_params;
  gsize n;
  guint signal_id;
  info = (_ExtendedGDBusSignalInfo *) g_dbus_interface_info_lookup_signal ((GDBusInterfaceInfo *) &_greetable_interface_info.parent_struct, signal_name);
  if (info == NULL)
    return;
  num_params = g_variant_n_children (parameters);
  paramv = g_new0 (GValue, num_params + 1);
  g_value_init (&paramv[0], TYPE_GREETABLE);
  g_value_set_object (&paramv[0], proxy);
  g_variant_iter_init (&iter, parameters);
  n = 1;
  while ((child = g_variant_iter_next_value (&iter)) != NULL)
    {
      _ExtendedGDBusArgInfo *arg_info = (_ExtendedGDBusArgInfo *) info->parent_struct.args[n - 1];
      if (arg_info->use_gvariant)
        {
          g_value_init (&paramv[n], G_TYPE_VARIANT);
          g_value_set_variant (&paramv[n], child);
          n++;
        }
      else
        g_dbus_gvariant_to_gvalue (child, &paramv[n++]);
      g_variant_unref (child);
    }
  signal_id = g_signal_lookup (info->signal_name, TYPE_GREETABLE);
  g_signal_emitv (paramv, signal_id, 0, NULL);
  for (n = 0; n < num_params + 1; n++)
    g_value_unset (&paramv[n]);
  g_free (paramv);
}